

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

boolean get_interesting_appn(j_decompress_ptr cinfo)

{
  int iVar1;
  long lVar2;
  byte *pbVar3;
  long *in_RDI;
  size_t bytes_in_buffer;
  JOCTET *next_input_byte;
  jpeg_source_mgr *datasrc;
  uint numtoread;
  uint i;
  JOCTET b [14];
  JLONG length;
  byte *pbVar4;
  uint datalen;
  JOCTET *data;
  uint uVar5;
  uint uVar6;
  byte local_26 [14];
  long local_18;
  long *local_10;
  
  data = (JOCTET *)in_RDI[5];
  pbVar4 = *(byte **)data;
  lVar2 = *(long *)(data + 8);
  local_10 = in_RDI;
  if (lVar2 == 0) {
    iVar1 = (**(code **)(data + 0x18))(in_RDI);
    if (iVar1 == 0) {
      return 0;
    }
    pbVar4 = *(byte **)data;
    lVar2 = *(long *)(data + 8);
  }
  lVar2 = lVar2 + -1;
  pbVar3 = pbVar4 + 1;
  local_18 = (ulong)*pbVar4 << 8;
  if (lVar2 == 0) {
    iVar1 = (**(code **)(data + 0x18))(local_10);
    if (iVar1 == 0) {
      return 0;
    }
    pbVar3 = *(byte **)data;
    lVar2 = *(long *)(data + 8);
  }
  local_18 = (ulong)*pbVar3 + local_18 + -2;
  if (local_18 < 0xe) {
    if (local_18 < 1) {
      uVar5 = 0;
    }
    else {
      uVar5 = (uint)local_18;
    }
  }
  else {
    uVar5 = 0xe;
  }
  uVar6 = 0;
  do {
    pbVar3 = pbVar3 + 1;
    lVar2 = lVar2 + -1;
    if (uVar5 <= uVar6) {
      local_18 = local_18 - (ulong)uVar5;
      datalen = (uint)((ulong)pbVar3 >> 0x20);
      if (*(int *)((long)local_10 + 0x21c) == 0xe0) {
        examine_app0((j_decompress_ptr)CONCAT44(uVar6,uVar5),data,datalen,lVar2);
      }
      else if (*(int *)((long)local_10 + 0x21c) == 0xee) {
        examine_app14((j_decompress_ptr)CONCAT44(uVar6,uVar5),data,datalen,lVar2);
      }
      else {
        *(undefined4 *)(*local_10 + 0x28) = 0x44;
        *(undefined4 *)(*local_10 + 0x2c) = *(undefined4 *)((long)local_10 + 0x21c);
        (**(code **)*local_10)(local_10);
      }
      *(byte **)data = pbVar3;
      *(long *)(data + 8) = lVar2;
      if (0 < local_18) {
        (**(code **)(local_10[5] + 0x20))(local_10,local_18);
      }
      return 1;
    }
    if (lVar2 == 0) {
      iVar1 = (**(code **)(data + 0x18))(local_10);
      if (iVar1 == 0) {
        return 0;
      }
      pbVar3 = *(byte **)data;
      lVar2 = *(long *)(data + 8);
    }
    local_26[uVar6] = *pbVar3;
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

METHODDEF(boolean)
get_interesting_appn(j_decompress_ptr cinfo)
/* Process an APP0 or APP14 marker without saving it */
{
  JLONG length;
  JOCTET b[APPN_DATA_LEN];
  unsigned int i, numtoread;
  INPUT_VARS(cinfo);

  INPUT_2BYTES(cinfo, length, return FALSE);
  length -= 2;

  /* get the interesting part of the marker data */
  if (length >= APPN_DATA_LEN)
    numtoread = APPN_DATA_LEN;
  else if (length > 0)
    numtoread = (unsigned int)length;
  else
    numtoread = 0;
  for (i = 0; i < numtoread; i++)
    INPUT_BYTE(cinfo, b[i], return FALSE);
  length -= numtoread;

  /* process it */
  switch (cinfo->unread_marker) {
  case M_APP0:
    examine_app0(cinfo, (JOCTET *)b, numtoread, length);
    break;
  case M_APP14:
    examine_app14(cinfo, (JOCTET *)b, numtoread, length);
    break;
  default:
    /* can't get here unless jpeg_save_markers chooses wrong processor */
    ERREXIT1(cinfo, JERR_UNKNOWN_MARKER, cinfo->unread_marker);
    break;
  }

  /* skip any remaining data -- could be lots */
  INPUT_SYNC(cinfo);
  if (length > 0)
    (*cinfo->src->skip_input_data) (cinfo, (long)length);

  return TRUE;
}